

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O3

uint16_t handleQuantizeEqualExp
                   (uint16_t abssrc,uint16_t tolSig,float errTol,float srcFloat,int doprint)

{
  uint16_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  uint16_t uVar7;
  uint uVar8;
  uint16_t uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float local_3c;
  
  uVar5 = (uint)abssrc;
  uVar2 = uVar5 & 0x7ff;
  uVar6 = 0xf400;
  if ((ushort)uVar2 < tolSig) {
    uVar6 = 0xe000;
  }
  fVar12 = errTol;
  if (doprint == 0) {
    uVar2 = uVar5 - (abssrc >> 1 & 0x5555);
    uVar2 = (uVar2 >> 2 & 0x3333) + (uVar2 & 0x3333);
    uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f;
    uVar10 = (uVar2 >> 8) + uVar2 & 0xff;
    uVar2 = (int)(short)uVar6 & uVar5;
    if (abssrc < 0x800) goto LAB_0011b7f5;
LAB_0011b916:
    uVar3 = uVar5 & 0x7800;
    uVar9 = (uint16_t)uVar3;
    if ((uint16_t)(uVar5 & 0x7000) != uVar9) {
      uVar2 = uVar5 & 0x7000;
    }
    uVar7 = (uint16_t)uVar2;
    uVar4 = uVar2 - (uVar2 >> 1 & 0x5555);
    uVar4 = (uVar4 >> 2 & 0x3333) + (uVar4 & 0x3333);
    uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f;
    uVar4 = (uVar4 >> 8) + uVar4;
    uVar8 = uVar4 & 0xff;
    if (uVar8 < uVar10) {
      fVar11 = srcFloat - *(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4);
      uVar1 = uVar7;
      if (errTol <= fVar11) {
        uVar1 = abssrc;
      }
      uVar4 = uVar4 & 0xff;
      fVar12 = fVar11;
      uVar2 = uVar4;
      if (errTol <= fVar11) {
        fVar12 = errTol;
        uVar2 = uVar10;
      }
      uVar10 = uVar2;
      abssrc = uVar1;
      if ((doprint != 0) && (fVar11 < errTol)) {
        printf("  smltst 0x%04X delta %g\n",(double)fVar11);
        uVar10 = uVar4;
        fVar12 = fVar11;
        abssrc = uVar7;
      }
    }
    else if ((uVar10 == uVar8) &&
            (fVar11 = srcFloat - *(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4),
            fVar11 < errTol)) {
      fVar12 = fVar11;
      abssrc = uVar7;
    }
    uVar2 = uVar3 - (uVar3 >> 1 & 0x1555);
    uVar2 = (uVar2 >> 2 & 0x3333) + (uVar2 & 0x3333);
    uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f;
    uVar2 = (uVar2 >> 8) + uVar2 & 0xff;
    if (uVar10 <= uVar2) {
      if ((uVar10 == uVar2) &&
         (fVar11 = srcFloat - *(float *)(_imath_half_to_float_table + (ulong)uVar3 * 4),
         fVar11 < fVar12)) {
        fVar12 = fVar11;
        abssrc = uVar9;
      }
      goto LAB_0011baf5;
    }
    local_3c = srcFloat - *(float *)(_imath_half_to_float_table + (ulong)uVar3 * 4);
    if (local_3c < errTol) {
      fVar12 = local_3c;
      uVar10 = uVar2;
      abssrc = uVar9;
    }
    if ((doprint == 0) || (errTol <= local_3c)) goto LAB_0011baf5;
    printf("  smltst 0x%04X delta %g\n",(double)local_3c,(ulong)uVar3);
    uVar10 = uVar2;
  }
  else {
    puts("  === npow2 == 0x0800");
    printf("  srcMV  0x%04X %016b\n",(ulong)uVar2,(ulong)uVar2);
    printf("  mask2  0x%04X %016b\n",0xf000,0xf000);
    printf("  mask3  0x%04X %016b\n",(ulong)uVar6);
    uVar2 = uVar5 - (abssrc >> 1 & 0x5555);
    uVar2 = (uVar2 >> 2 & 0x3333) + (uVar2 & 0x3333);
    uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f;
    uVar10 = (uVar2 >> 8) + uVar2 & 0xff;
    if (0x7ff < abssrc) {
      printf("  test0  0x%04X %016b\n",(ulong)(uVar5 & 0x7000));
      printf("  test1  0x%04X %016b\n",(ulong)(uVar5 & 0x7800));
      uVar2 = (int)(short)uVar6 & uVar5;
      printf("  xxxxx  0x%04X %016b\n",(ulong)uVar2);
      printf("  test2  0x%04X %016b\n",(ulong)(uVar5 + 0x800 & 0xf800));
      goto LAB_0011b916;
    }
    uVar2 = (int)(short)uVar6 & uVar5;
    printf("  test0  0x%04X %016b\n",(ulong)uVar2);
    printf("  test1  0x%04X %016b\n",0x800,0x800);
LAB_0011b7f5:
    uVar3 = uVar2 - (uVar2 >> 1 & 0x5555);
    uVar3 = (uVar3 >> 2 & 0x3333) + (uVar3 & 0x3333);
    uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f;
    uVar3 = (uVar3 >> 8) + uVar3;
    uVar4 = uVar3 & 0xff;
    if (uVar10 <= uVar4) {
      if ((uVar10 == uVar4) &&
         (fVar11 = srcFloat - *(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4),
         fVar11 < errTol)) {
        fVar12 = fVar11;
        abssrc = (uint16_t)uVar2;
      }
      goto LAB_0011baf5;
    }
    local_3c = srcFloat - *(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4);
    uVar9 = (uint16_t)uVar2;
    if (errTol <= local_3c) {
      uVar9 = abssrc;
    }
    uVar3 = uVar3 & 0xff;
    fVar12 = local_3c;
    uVar4 = uVar3;
    if (errTol <= local_3c) {
      fVar12 = errTol;
      uVar4 = uVar10;
    }
    uVar10 = uVar4;
    abssrc = uVar9;
    if ((doprint == 0) || (errTol <= local_3c)) goto LAB_0011baf5;
    printf("  smltst 0x%04X delta %g\n",(double)local_3c);
    uVar10 = uVar3;
    uVar3 = uVar2;
  }
  fVar12 = local_3c;
  abssrc = (uint16_t)uVar3;
LAB_0011baf5:
  uVar5 = (uVar5 & 0xfffff800) + 0x800;
  uVar3 = uVar5 & 0xffff;
  uVar2 = ((uVar3 >> 0xb) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c;
  uVar9 = (uint16_t)uVar5;
  if (uVar2 < uVar10) {
    fVar12 = *(float *)(_imath_half_to_float_table + (ulong)uVar3 * 4) - srcFloat;
    if (fVar12 < errTol) {
      abssrc = uVar9;
    }
    if (doprint == 0) {
      return abssrc;
    }
    if (errTol <= fVar12) {
      return abssrc;
    }
    printf("  lrgtst 0x%04X delta %g\n",(double)fVar12);
  }
  else {
    if (uVar10 != uVar2) {
      return abssrc;
    }
    if (fVar12 <= *(float *)(_imath_half_to_float_table + (ulong)uVar3 * 4) - srcFloat) {
      return abssrc;
    }
  }
  return uVar9;
}

Assistant:

static uint16_t handleQuantizeEqualExp (
    uint16_t abssrc, uint16_t tolSig, float errTol, float srcFloat, int doprint)
{
    const uint16_t npow2 = 0x0800;
    const uint16_t lowermask = npow2 - 1;
    const uint16_t mask = ~lowermask;
    const uint16_t mask2 = mask ^ npow2;

    const uint16_t srcMaskedVal = abssrc & lowermask;
    const uint16_t extrabit = (tolSig > srcMaskedVal);

    const uint16_t mask3 = mask2 ^ (((npow2 << 1) * (extrabit)) |
                                    ((npow2 >> 1) * (!extrabit)));

    if (doprint)
    {
        printf ("  === npow2 == 0x0800\n");
        printf ("  srcMV  0x%04X %016b\n", srcMaskedVal, srcMaskedVal);
        printf ("  mask2  0x%04X %016b\n", mask2, mask2);
        printf ("  mask3  0x%04X %016b\n", mask3, mask3);
    }

    // not yet clear how to narrow down below 3 values...
    uint16_t alt, smallest = abssrc;
    int bits, smallbits = countSetBits(abssrc);
    float delta, smalldelta = errTol;

    // doing in this order mask2, mask, +npow guarantees sorting of values
    // so can avoid a couple of conditionals in the macros
    if (srcMaskedVal == abssrc)
    {
        if (doprint)
        {
            printf ("  test0  0x%04X %016b\n", (abssrc & mask3), (abssrc & mask3));
            printf ("  test1  0x%04X %016b\n", ((abssrc + npow2) & mask), ((abssrc + npow2) & mask));
        }
        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask3);
    }
    else
    {
        if (doprint)
        {
            printf ("  test0  0x%04X %016b\n", (abssrc & mask2), (abssrc & mask2));
            printf ("  test1  0x%04X %016b\n", (abssrc & mask), (abssrc & mask));
            printf ("  xxxxx  0x%04X %016b\n", (abssrc & mask3), (abssrc & mask3));
            printf ("  test2  0x%04X %016b\n", ((abssrc + npow2) & mask), ((abssrc + npow2) & mask));
        }
        uint16_t alt0 = (abssrc & mask2);
        uint16_t alt1 = (abssrc & mask);
        if (alt0 == alt1) alt0 = (abssrc & mask3);

        TEST_QUANT_ALTERNATE_SMALL(alt0);
        TEST_QUANT_ALTERNATE_SMALL(alt1);
    }
    TEST_QUANT_ALTERNATE_LARGE((abssrc + npow2) & mask);

    return smallest;
}